

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

void __thiscall
gl4cts::GPUShaderFP64Test3::writeVaryingPassthrough
          (GPUShaderFP64Test3 *this,ostream *stream,shaderStage shader_stage)

{
  int iVar1;
  undefined *puVar2;
  size_t sVar3;
  char *__s;
  
  iVar1 = (int)stream;
  if (shader_stage == TESS_EVAL_SHADER) {
    std::__ostream_insert<char,std::char_traits<char>>(stream,"    ",4);
    puVar2 = m_varying_name_tes_gs_tcs_result;
    if (m_varying_name_tes_gs_tcs_result == (undefined *)0x0) {
      std::ios::clear(iVar1 + (int)stream->_vptr_basic_ostream[-3]);
    }
    else {
      sVar3 = strlen(m_varying_name_tes_gs_tcs_result);
      std::__ostream_insert<char,std::char_traits<char>>(stream,puVar2,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(stream," = ",3);
    puVar2 = m_varying_name_tcs_tes_tcs_result;
    if (m_varying_name_tcs_tes_tcs_result == (undefined *)0x0) {
      std::ios::clear(iVar1 + (int)stream->_vptr_basic_ostream[-3]);
    }
    else {
      sVar3 = strlen(m_varying_name_tcs_tes_tcs_result);
      std::__ostream_insert<char,std::char_traits<char>>(stream,puVar2,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(stream,"[0];\n",5);
    std::__ostream_insert<char,std::char_traits<char>>(stream,"    ",4);
    puVar2 = m_varying_name_tes_gs_vs_result;
    if (m_varying_name_tes_gs_vs_result == (undefined *)0x0) {
      std::ios::clear(iVar1 + (int)stream->_vptr_basic_ostream[-3]);
    }
    else {
      sVar3 = strlen(m_varying_name_tes_gs_vs_result);
      std::__ostream_insert<char,std::char_traits<char>>(stream,puVar2,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(stream," = ",3);
    __s = m_varying_name_tcs_tes_vs_result;
  }
  else if (shader_stage == TESS_CONTROL_SHADER) {
    std::__ostream_insert<char,std::char_traits<char>>(stream,"    ",4);
    puVar2 = m_varying_name_tcs_tes_vs_result;
    if (m_varying_name_tcs_tes_vs_result == (undefined *)0x0) {
      std::ios::clear(iVar1 + (int)stream->_vptr_basic_ostream[-3]);
    }
    else {
      sVar3 = strlen(m_varying_name_tcs_tes_vs_result);
      std::__ostream_insert<char,std::char_traits<char>>(stream,puVar2,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(stream,"[gl_InvocationID] = ",0x14);
    __s = m_varying_name_vs_tcs_vs_result;
  }
  else {
    if (shader_stage != GEOMETRY_SHADER) {
      return;
    }
    std::__ostream_insert<char,std::char_traits<char>>(stream,"    ",4);
    puVar2 = m_varying_name_gs_fs_tcs_result;
    if (m_varying_name_gs_fs_tcs_result == (undefined *)0x0) {
      std::ios::clear(iVar1 + (int)stream->_vptr_basic_ostream[-3]);
    }
    else {
      sVar3 = strlen(m_varying_name_gs_fs_tcs_result);
      std::__ostream_insert<char,std::char_traits<char>>(stream,puVar2,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(stream," = ",3);
    puVar2 = m_varying_name_tes_gs_tcs_result;
    if (m_varying_name_tes_gs_tcs_result == (undefined *)0x0) {
      std::ios::clear(iVar1 + (int)stream->_vptr_basic_ostream[-3]);
    }
    else {
      sVar3 = strlen(m_varying_name_tes_gs_tcs_result);
      std::__ostream_insert<char,std::char_traits<char>>(stream,puVar2,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(stream,"[0];\n",5);
    std::__ostream_insert<char,std::char_traits<char>>(stream,"    ",4);
    puVar2 = m_varying_name_gs_fs_tes_result;
    if (m_varying_name_gs_fs_tes_result == (undefined *)0x0) {
      std::ios::clear(iVar1 + (int)stream->_vptr_basic_ostream[-3]);
    }
    else {
      sVar3 = strlen(m_varying_name_gs_fs_tes_result);
      std::__ostream_insert<char,std::char_traits<char>>(stream,puVar2,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(stream," = ",3);
    puVar2 = m_varying_name_tes_gs_tes_result;
    if (m_varying_name_tes_gs_tes_result == (undefined *)0x0) {
      std::ios::clear(iVar1 + (int)stream->_vptr_basic_ostream[-3]);
    }
    else {
      sVar3 = strlen(m_varying_name_tes_gs_tes_result);
      std::__ostream_insert<char,std::char_traits<char>>(stream,puVar2,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(stream,"[0];\n",5);
    std::__ostream_insert<char,std::char_traits<char>>(stream,"    ",4);
    puVar2 = m_varying_name_gs_fs_vs_result;
    if (m_varying_name_gs_fs_vs_result == (undefined *)0x0) {
      std::ios::clear(iVar1 + (int)stream->_vptr_basic_ostream[-3]);
    }
    else {
      sVar3 = strlen(m_varying_name_gs_fs_vs_result);
      std::__ostream_insert<char,std::char_traits<char>>(stream,puVar2,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(stream," = ",3);
    __s = m_varying_name_tes_gs_vs_result;
  }
  if (__s == (char *)0x0) {
    std::ios::clear(iVar1 + (int)stream->_vptr_basic_ostream[-3]);
  }
  else {
    sVar3 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(stream,__s,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,"[0];\n",5);
  return;
}

Assistant:

void GPUShaderFP64Test3::writeVaryingPassthrough(std::ostream& stream, shaderStage shader_stage) const
{
	switch (shader_stage)
	{
	case FRAGMENT_SHADER:
		break;

	case GEOMETRY_SHADER:

		stream << "    " << m_varying_name_gs_fs_tcs_result << " = " << m_varying_name_tes_gs_tcs_result << "[0];\n";
		stream << "    " << m_varying_name_gs_fs_tes_result << " = " << m_varying_name_tes_gs_tes_result << "[0];\n";
		stream << "    " << m_varying_name_gs_fs_vs_result << " = " << m_varying_name_tes_gs_vs_result << "[0];\n";

		break;

	case TESS_CONTROL_SHADER:

		stream << "    " << m_varying_name_tcs_tes_vs_result
			   << "[gl_InvocationID] = " << m_varying_name_vs_tcs_vs_result << "[0];\n";

		break;

	case TESS_EVAL_SHADER:

		stream << "    " << m_varying_name_tes_gs_tcs_result << " = " << m_varying_name_tcs_tes_tcs_result << "[0];\n";
		stream << "    " << m_varying_name_tes_gs_vs_result << " = " << m_varying_name_tcs_tes_vs_result << "[0];\n";

		break;

	case VERTEX_SHADER:

		break;
	}
}